

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  xmlChar *pxVar3;
  uint uVar4;
  int len;
  int iVar5;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj_00;
  xmlXPathObjectPtr obj_01;
  xmlLocationSetPtr pxVar7;
  xmlXPathObjectPtr pxVar8;
  int *piVar9;
  xmlNodePtr pxVar10;
  xmlChar *pxVar11;
  int iVar12;
  ulong uVar13;
  xmlNodePtr end;
  int iVar14;
  xmlChar xVar15;
  long lVar16;
  xmlNodePtr pxVar17;
  int iVar18;
  xmlNodePtr cur;
  xmlNodePtr start;
  int rindx;
  xmlNodePtr rend;
  int local_cc;
  int local_c8;
  char local_c3;
  char local_c2;
  xmlChar local_c1;
  xmlNodePtr local_c0;
  xmlNodePtr local_b8;
  xmlLocationSetPtr local_b0;
  xmlXPathObjectPtr local_a8;
  int local_a0;
  int local_9c;
  xmlChar *local_98;
  xmlChar *local_90;
  int local_88;
  int local_84;
  xmlXPathParserContextPtr local_80;
  int *local_78;
  xmlXPathObjectPtr local_70;
  xmlNodePtr local_68;
  xmlNodePtr local_60;
  xmlXPathObjectPtr local_58;
  ulong local_50;
  xmlXPathObjectPtr local_48;
  long local_40;
  ulong local_38;
  
  if (nargs - 5U < 0xfffffffd) {
    xmlXPathErr(ctxt,0xc);
    return;
  }
  if ((uint)nargs < 4) {
    iVar12 = -1;
    uVar13 = 0;
    obj = (xmlXPathObjectPtr)0x0;
    pxVar6 = (xmlXPathObjectPtr)0x0;
    if (nargs == 3) goto LAB_001eb2d2;
LAB_001eb333:
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
      local_88 = iVar12;
      obj_00 = valuePop(ctxt);
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
         ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
        xmlXPathErr(ctxt,0xb);
        obj_01 = (xmlXPathObjectPtr)0x0;
        goto LAB_001eb3fc;
      }
      obj_01 = valuePop(ctxt);
      pxVar7 = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
      if (pxVar7 == (xmlLocationSetPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
        xmlXPathErr(ctxt,0xf);
        goto LAB_001eb3fc;
      }
      pxVar7->locNr = 0;
      pxVar7->locMax = 0;
      pxVar7->locTab = (xmlXPathObjectPtr *)0x0;
      local_b0 = pxVar7;
      local_80 = ctxt;
      if (obj_01->nodesetval != (xmlNodeSetPtr)0x0) {
        pxVar8 = obj_01;
        if (obj_01->type == XPATH_NODESET) {
          pxVar8 = xmlXPtrNewLocationSetNodeSet(obj_01->nodesetval);
          xmlXPathFreeObject(obj_01);
          if (pxVar8 == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(local_80,0xf);
            goto LAB_001eb90f;
          }
        }
        local_78 = (int *)pxVar8->user;
        obj_01 = pxVar8;
        if (0 < *local_78) {
          local_c2 = 0 < (int)uVar13 && obj != (xmlXPathObjectPtr)0x0;
          local_c3 = (int)uVar13 < 1 && obj != (xmlXPathObjectPtr)0x0;
          local_b8 = (xmlNodePtr)0x0;
          local_cc = 0;
          lVar16 = 0;
          local_a8 = obj_00;
          local_70 = pxVar6;
          local_58 = pxVar8;
          local_50 = uVar13;
          local_48 = obj;
          do {
            pxVar6 = local_a8;
            piVar9 = *(int **)(*(long *)(local_78 + 2) + lVar16 * 8);
            cur = local_b8;
            if (piVar9 != (int *)0x0) {
              if (*piVar9 - 5U < 2) {
                local_c0 = *(xmlNodePtr *)(piVar9 + 10);
                local_c8 = piVar9[0xc];
                if (local_c8 < 1) {
                  local_c8 = 0;
                }
                piVar9 = *(int **)(*(long *)(local_78 + 2) + lVar16 * 8);
                if (piVar9 == (int *)0x0) goto LAB_001eb544;
              }
              if (*piVar9 - 5U < 2) {
                cur = *(xmlNodePtr *)(piVar9 + 10);
                local_cc = piVar9[0xc];
                if (local_cc < 1) {
                  local_cc = 0;
                }
              }
            }
LAB_001eb544:
            xmlXPtrAdvanceChar(&local_c0,&local_c8,0);
            local_40 = lVar16;
            if (cur == (xmlNodePtr)0x0) {
              cur = (xmlNodePtr)0x0;
            }
            else {
              xVar2 = cur->type;
              pxVar10 = cur;
              if ((xVar2 == XML_ELEMENT_NODE) || (xVar2 == XML_DOCUMENT_NODE)) {
LAB_001eb57d:
                if (0 < local_cc) {
                  pxVar10 = xmlXPtrGetNthChild(cur,local_cc);
                }
              }
              else {
                if (xVar2 == XML_NAMESPACE_DECL) goto LAB_001eb5c4;
                if (xVar2 == XML_HTML_DOCUMENT_NODE) goto LAB_001eb57d;
              }
              do {
                pxVar17 = pxVar10;
                if (pxVar17 == (xmlNodePtr)0x0) goto LAB_001eb5c4;
                pxVar10 = pxVar17->last;
              } while (pxVar17->last != (_xmlNode *)0x0);
              if ((pxVar17->type != XML_ELEMENT_NODE) && (pxVar17->content != (xmlChar *)0x0)) {
                local_cc = xmlStrlen(pxVar17->content);
                cur = pxVar17;
              }
            }
LAB_001eb5c4:
            local_98 = pxVar6->stringval;
            local_b8 = cur;
            if (local_98 != (xmlChar *)0x0) {
              while ((local_c0 != (xmlNodePtr)0x0 && (local_c0->type != XML_NAMESPACE_DECL))) {
                iVar12 = local_c8 + -1;
                xVar15 = *local_98;
                pxVar10 = local_c0;
LAB_001eb604:
                if (((pxVar10->type == XML_ELEMENT_NODE) || (pxVar10->content == (xmlChar *)0x0)) ||
                   (uVar4 = xmlStrlen(pxVar10->content), (int)uVar4 < iVar12)) {
LAB_001eb61d:
                  if ((pxVar10 == cur) && (local_cc <= iVar12)) break;
                  pxVar10 = xmlXPtrAdvanceNode(pxVar10,(int *)0x0);
                  iVar12 = 1;
                  if (pxVar10 == (xmlNodePtr)0x0) break;
                  goto LAB_001eb604;
                }
                if (xVar15 != '\0') {
                  local_38 = (ulong)uVar4;
                  local_84 = uVar4 + 1;
                  local_c1 = xVar15;
                  local_68 = pxVar10;
                  do {
                    pxVar10 = local_68;
                    xVar15 = local_c1;
                    pxVar11 = xmlStrchr(local_68->content + iVar12,local_c1);
                    pxVar3 = local_98;
                    iVar12 = local_84;
                    if (pxVar11 == (xmlChar *)0x0) break;
                    iVar14 = (int)pxVar11 - *(int *)&pxVar10->content;
                    local_a0 = iVar14 + 1;
                    pxVar17 = local_68;
                    iVar5 = local_a0;
                    iVar12 = local_cc;
                    if ((pxVar10->type == XML_NAMESPACE_DECL) || (cur == (xmlNodePtr)0x0)) {
                      end = (xmlNodePtr)0x0;
                      if (pxVar10->type == XML_NAMESPACE_DECL) {
                        end = cur;
                      }
                      goto LAB_001eb7a4;
                    }
                    end = cur;
                    if (cur->type == XML_NAMESPACE_DECL) goto LAB_001eb7a4;
                    len = xmlStrlen(local_98);
                    local_90 = pxVar3;
                    iVar18 = iVar14;
                    do {
                      end = local_b8;
                      pxVar17 = local_68;
                      iVar5 = local_a0;
                      iVar12 = local_cc;
                      if (len < 1) goto LAB_001eb7a4;
                      iVar12 = len + iVar18;
                      if ((pxVar10 == local_b8) && (local_cc < iVar12)) break;
                      if ((pxVar10->type != XML_ELEMENT_NODE) &&
                         (pxVar10->content != (xmlChar *)0x0)) {
                        iVar5 = xmlStrlen(pxVar10->content);
                        if (iVar12 <= iVar5) {
                          iVar18 = xmlStrncmp(pxVar10->content + iVar18,local_90,len);
                          end = pxVar10;
                          pxVar17 = local_68;
                          iVar5 = local_a0;
                          if (iVar18 == 0) goto LAB_001eb7a4;
                          break;
                        }
                        iVar5 = iVar5 - iVar18;
                        iVar12 = xmlStrncmp(pxVar10->content + iVar18,local_90,iVar5);
                        if (iVar12 != 0) break;
                        local_90 = local_90 + iVar5;
                        len = len - iVar5;
                      }
                      iVar18 = 0;
                      pxVar10 = xmlXPtrAdvanceNode(pxVar10,(int *)0x0);
                    } while (pxVar10 != (xmlNodePtr)0x0);
                    pxVar10 = local_68;
                    cur = local_b8;
                    iVar12 = local_a0;
                    xVar15 = local_c1;
                  } while (iVar14 < (int)local_38);
                  goto LAB_001eb61d;
                }
                end = pxVar10;
                pxVar17 = pxVar10;
                iVar5 = iVar12 + 1;
                iVar12 = iVar12 + 1;
LAB_001eb7a4:
                local_c8 = iVar5;
                local_c0 = pxVar17;
                if (local_70 == (xmlXPathObjectPtr)0x0) {
                  pxVar6 = xmlXPtrNewRange(pxVar17,iVar5,end,iVar12);
                  xmlXPtrLocationSetAdd(local_b0,pxVar6);
                  cur = local_b8;
                }
                else {
                  iVar5 = xmlXPtrAdvanceChar(&local_c0,&local_c8,local_88);
                  cur = local_b8;
                  if (iVar5 == 0) {
                    if (local_c2 == '\0') {
                      pxVar10 = end;
                      iVar5 = iVar12;
                      if (local_c3 != '\0') {
                        pxVar10 = local_c0;
                        iVar5 = local_c8;
                      }
                    }
                    else {
                      local_60 = local_c0;
                      local_9c = local_c8 + -1;
                      iVar14 = xmlXPtrAdvanceChar(&local_60,&local_9c,(int)local_50);
                      pxVar10 = local_60;
                      iVar5 = local_9c;
                      if (iVar14 != 0) goto LAB_001eb894;
                    }
                    pxVar6 = xmlXPtrNewRange(local_c0,local_c8,pxVar10,iVar5);
                    xmlXPtrLocationSetAdd(local_b0,pxVar6);
                  }
                }
LAB_001eb894:
                local_98 = local_a8->stringval;
                local_c8 = iVar12;
                local_c0 = end;
                if (*local_98 == '\0') {
                  local_c8 = iVar12 + 1;
                }
              }
            }
            lVar16 = local_40 + 1;
            obj_01 = local_58;
            pxVar6 = local_70;
            obj_00 = local_a8;
            obj = local_48;
          } while (lVar16 < *local_78);
        }
      }
LAB_001eb90f:
      pxVar8 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (pxVar8 == (xmlXPathObjectPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
      }
      else {
        *(undefined8 *)pxVar8 = 0;
        pxVar8->nodesetval = (xmlNodeSetPtr)0x0;
        pxVar8->stringval = (xmlChar *)0x0;
        pxVar8->user = (void *)0x0;
        *(undefined8 *)&pxVar8->index = 0;
        pxVar8->user2 = (void *)0x0;
        *(undefined8 *)&pxVar8->boolval = 0;
        pxVar8->floatval = 0.0;
        *(undefined8 *)&pxVar8->index2 = 0;
        pxVar8->type = XPATH_LOCATIONSET;
        pxVar8->user = local_b0;
      }
      valuePush(local_80,pxVar8);
      goto LAB_001eb3fc;
    }
    xmlXPathErr(ctxt,0xb);
  }
  else {
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathErr(ctxt,0xb);
      obj = (xmlXPathObjectPtr)0x0;
    }
    else {
      obj = valuePop(ctxt);
      if (obj == (xmlXPathObjectPtr)0x0) {
        uVar13 = 0;
        obj = (xmlXPathObjectPtr)0x0;
      }
      else {
        uVar13 = (ulong)(uint)(int)obj->floatval;
      }
LAB_001eb2d2:
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NUMBER)) {
        pxVar6 = valuePop(ctxt);
        if (pxVar6 == (xmlXPathObjectPtr)0x0) {
          iVar12 = -1;
          pxVar6 = (xmlXPathObjectPtr)0x0;
        }
        else {
          iVar12 = (int)pxVar6->floatval + -1;
        }
        goto LAB_001eb333;
      }
      xmlXPathErr(ctxt,0xb);
    }
    pxVar6 = (xmlXPathObjectPtr)0x0;
  }
  obj_01 = (xmlXPathObjectPtr)0x0;
  obj_00 = (xmlXPathObjectPtr)0x0;
LAB_001eb3fc:
  xmlXPathFreeObject(obj_01);
  xmlXPathFreeObject(obj_00);
  if (pxVar6 != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(pxVar6);
  }
  if (obj != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(obj);
  }
  return;
}

Assistant:

static void
xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i, startindex, endindex = 0, fendindex;
    xmlNodePtr start, end = 0, fend;
    xmlXPathObjectPtr set = NULL;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset = NULL;
    xmlXPathObjectPtr string = NULL;
    xmlXPathObjectPtr position = NULL;
    xmlXPathObjectPtr number = NULL;
    int found, pos = 0, num = 0;

    /*
     * Grab the arguments
     */
    if ((nargs < 2) || (nargs > 4))
	XP_ERROR(XPATH_INVALID_ARITY);

    if (nargs >= 4) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	number = valuePop(ctxt);
	if (number != NULL)
	    num = (int) number->floatval;
    }
    if (nargs >= 3) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	position = valuePop(ctxt);
	if (position != NULL)
	    pos = (int) position->floatval;
    }
    if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_STRING)) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    string = valuePop(ctxt);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET))) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    set = valuePop(ctxt);
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
        xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
        goto error;
    }
    if (set->nodesetval == NULL) {
        goto error;
    }
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL) {
            xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
            goto error;
        }
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to search for each element in the location set
     * the list of location set corresponding to that search
     */
    for (i = 0;i < oldset->locNr;i++) {
#ifdef DEBUG_RANGES
	xmlXPathDebugDumpObject(stdout, oldset->locTab[i], 0);
#endif

	xmlXPtrGetStartPoint(oldset->locTab[i], &start, &startindex);
	xmlXPtrGetEndPoint(oldset->locTab[i], &end, &endindex);
	xmlXPtrAdvanceChar(&start, &startindex, 0);
	xmlXPtrGetLastChar(&end, &endindex);

#ifdef DEBUG_RANGES
	xmlGenericError(xmlGenericErrorContext,
		"from index %d of ->", startindex);
	xmlDebugDumpString(stdout, start->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
	xmlGenericError(xmlGenericErrorContext,
		"to index %d of ->", endindex);
	xmlDebugDumpString(stdout, end->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
#endif
	do {
            fend = end;
            fendindex = endindex;
	    found = xmlXPtrSearchString(string->stringval, &start, &startindex,
		                        &fend, &fendindex);
	    if (found == 1) {
		if (position == NULL) {
		    xmlXPtrLocationSetAdd(newset,
			 xmlXPtrNewRange(start, startindex, fend, fendindex));
		} else if (xmlXPtrAdvanceChar(&start, &startindex,
			                      pos - 1) == 0) {
		    if ((number != NULL) && (num > 0)) {
			int rindx;
			xmlNodePtr rend;
			rend = start;
			rindx = startindex - 1;
			if (xmlXPtrAdvanceChar(&rend, &rindx,
				               num) == 0) {
			    xmlXPtrLocationSetAdd(newset,
					xmlXPtrNewRange(start, startindex,
							rend, rindx));
			}
		    } else if ((number != NULL) && (num <= 0)) {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    start, startindex));
		    } else {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    fend, fendindex));
		    }
		}
		start = fend;
		startindex = fendindex;
		if (string->stringval[0] == 0)
		    startindex++;
	    }
	} while (found == 1);
    }

    /*
     * Save the new value and cleanup
     */
error:
    if (newset != NULL)
        valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
    xmlXPathFreeObject(string);
    if (position) xmlXPathFreeObject(position);
    if (number) xmlXPathFreeObject(number);
}